

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

str pybind11::detail::enum_name(handle arg)

{
  handle key;
  bool bVar1;
  PyObject *in_RDI;
  reference rVar2;
  value_type kv;
  dict_iterator __end2;
  dict_iterator __begin2;
  dict *__range2;
  dict entries;
  undefined7 in_stack_fffffffffffffec8;
  byte in_stack_fffffffffffffecf;
  accessor<pybind11::detail::accessor_policies::generic_item> *in_stack_fffffffffffffed0;
  char *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  handle this;
  handle h;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  PyObject *local_a0 [9];
  undefined1 *local_58;
  PyObject *local_40;
  PyObject local_38 [2];
  undefined1 local_18 [24];
  
  this.m_ptr = in_RDI;
  local_40 = (PyObject *)
             object_api<pybind11::handle>::get_type
                       ((object_api<pybind11::handle> *)
                        CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
  h.m_ptr = local_38;
  object_api<pybind11::handle>::attr
            ((object_api<pybind11::handle> *)
             CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),in_stack_fffffffffffffee0
            );
  dict::dict<pybind11::detail::accessor_policies::str_attr>
            ((dict *)in_RDI,
             (accessor<pybind11::detail::accessor_policies::str_attr> *)
             CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  accessor<pybind11::detail::accessor_policies::str_attr>::~accessor
            ((accessor<pybind11::detail::accessor_policies::str_attr> *)0x39d74b);
  local_58 = local_18;
  dict::begin((dict *)in_stack_fffffffffffffed0);
  dict::end((dict *)in_stack_fffffffffffffed0);
  do {
    bVar1 = operator!=((It *)in_stack_fffffffffffffed0,
                       (It *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
    in_stack_fffffffffffffeec = CONCAT13(bVar1,(int3)in_stack_fffffffffffffeec);
    if (!bVar1) {
      str::str((str *)in_RDI,(char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
LAB_0039d988:
      dict::~dict((dict *)0x39d995);
      return (str)this.m_ptr;
    }
    rVar2 = generic_iterator<pybind11::detail::iterator_policies::dict_readonly>::operator*
                      ((generic_iterator<pybind11::detail::iterator_policies::dict_readonly> *)
                       0x39d7bc);
    local_a0[0] = (PyObject *)rVar2.second.m_ptr;
    in_stack_fffffffffffffed0 =
         (accessor<pybind11::detail::accessor_policies::generic_item> *)local_a0;
    int_::int_<int,_0>((int_ *)in_RDI,in_stack_fffffffffffffeec);
    key.m_ptr._4_4_ = in_stack_ffffffffffffff0c;
    key.m_ptr._0_4_ = in_stack_ffffffffffffff08;
    object_api<pybind11::handle>::operator[]((object_api<pybind11::handle> *)h.m_ptr,key);
    accessor::operator_cast_to_object
              ((accessor<pybind11::detail::accessor_policies::generic_item> *)
               rVar2.second.m_ptr.m_ptr);
    in_stack_fffffffffffffecf =
         object_api<pybind11::handle>::equal
                   ((object_api<pybind11::handle> *)in_stack_fffffffffffffed0,
                    (object_api<pybind11::handle> *)
                    CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
    object::~object((object *)0x39d869);
    accessor<pybind11::detail::accessor_policies::generic_item>::~accessor
              (in_stack_fffffffffffffed0);
    int_::~int_((int_ *)0x39d87d);
    if ((in_stack_fffffffffffffecf & 1) != 0) {
      str::str((str *)this.m_ptr,h);
      goto LAB_0039d988;
    }
    generic_iterator<pybind11::detail::iterator_policies::dict_readonly>::operator++
              ((generic_iterator<pybind11::detail::iterator_policies::dict_readonly> *)
               in_stack_fffffffffffffed0);
  } while( true );
}

Assistant:

inline str enum_name(handle arg) {
    dict entries = arg.get_type().attr("__entries");
    for (auto kv : entries) {
        if (handle(kv.second[int_(0)]).equal(arg))
            return pybind11::str(kv.first);
    }
    return "???";
}